

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O3

TX_SIZE calculate_tx_size(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,uint var,uint sse,
                         int *force_skip)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  
  uVar6 = (ulong)(x->txfm_search_params).tx_mode_search_type;
  if (uVar6 != 2) {
    bVar3 = ""[uVar6];
    if (""[bsize] < ""[uVar6]) {
      bVar3 = ""[bsize];
    }
    goto LAB_0034ed3a;
  }
  iVar1 = (cpi->sf).rt_sf.tx_size_level_based_on_qstep;
  if (iVar1 == 0) {
    iVar4 = 8;
    uVar5 = 0;
LAB_0034eccb:
    bVar2 = true;
  }
  else {
    iVar8 = (int)x->plane[0].dequant_QTX[1] >> ((char)(x->e_mbd).bd - 5U & 0x1f);
    iVar4 = *(int *)(&DAT_0051a200 + (long)(x->qindex >> 6) * 4);
    uVar9 = iVar8 * iVar8;
    uVar5 = uVar9 * 2;
    if (iVar1 < 2) goto LAB_0034eccb;
    if ((((sse < uVar9) && (x->source_variance < uVar9)) && (x->color_sensitivity[0] == '\0')) &&
       (x->color_sensitivity[1] == '\0')) {
      *force_skip = 1;
    }
    bVar2 = uVar5 <= var;
  }
  if ((iVar4 * var >> 2 < sse) || (bVar7 = 1, var < uVar5)) {
    bVar7 = 4;
    if (""[bsize] < 4) {
      bVar7 = ""[bsize];
    }
  }
  if ((((cpi->oxcf).q_cfg.aq_mode != '\x03') ||
      (bVar3 = 1, !(bool)((*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7) - 1 < 2 & bVar2))) &&
     (bVar3 = 2, bVar7 < 2)) {
    bVar3 = bVar7;
  }
LAB_0034ed3a:
  if (1 < bVar3) {
    bVar3 = 2;
  }
  bVar7 = 2;
  if (uVar6 == 0) {
    bVar7 = bVar3;
  }
  if (bsize < BLOCK_32X64) {
    bVar7 = bVar3;
  }
  return bVar7;
}

Assistant:

static TX_SIZE calculate_tx_size(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 MACROBLOCK *const x, unsigned int var,
                                 unsigned int sse, int *force_skip) {
  MACROBLOCKD *const xd = &x->e_mbd;
  TX_SIZE tx_size;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT) {
    int multiplier = 8;
    unsigned int var_thresh = 0;
    unsigned int is_high_var = 1;
    // Use quantizer based thresholds to determine transform size.
    if (cpi->sf.rt_sf.tx_size_level_based_on_qstep) {
      const int qband = x->qindex >> (QINDEX_BITS - 2);
      const int mult[4] = { 8, 7, 6, 5 };
      assert(qband < 4);
      multiplier = mult[qband];
      const int qstep = x->plane[AOM_PLANE_Y].dequant_QTX[1] >> (xd->bd - 5);
      const unsigned int qstep_sq = qstep * qstep;
      var_thresh = qstep_sq * 2;
      if (cpi->sf.rt_sf.tx_size_level_based_on_qstep >= 2) {
        // If the sse is low for low source variance blocks, mark those as
        // transform skip.
        // Note: Though qstep_sq is based on ac qstep, the threshold is kept
        // low so that reliable early estimate of tx skip can be obtained
        // through its comparison with sse.
        if (sse < qstep_sq && x->source_variance < qstep_sq &&
            x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
            x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
          *force_skip = 1;
        // Further lower transform size based on aq mode only if residual
        // variance is high.
        is_high_var = (var >= var_thresh);
      }
    }
    // Choose larger transform size for blocks where dc component is dominant or
    // the ac component is low.
    if (sse > ((var * multiplier) >> 2) || (var < var_thresh))
      tx_size =
          AOMMIN(max_txsize_lookup[bsize],
                 tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
    else
      tx_size = TX_8X8;

    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        cyclic_refresh_segment_id_boosted(xd->mi[0]->segment_id) && is_high_var)
      tx_size = TX_8X8;
    else if (tx_size > TX_16X16)
      tx_size = TX_16X16;
  } else {
    tx_size =
        AOMMIN(max_txsize_lookup[bsize],
               tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
  }

  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize))
    tx_size = TX_SIZE_FOR_BSIZE_GT32;

  return AOMMIN(tx_size, TX_16X16);
}